

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_5e4c5e::PointerType::printLeft(PointerType *this,OutputStream *s)

{
  ObjCProtoName *this_00;
  char *pcVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  char cVar5;
  size_t sVar6;
  char cVar7;
  
  this_00 = (ObjCProtoName *)this->Pointee;
  if ((this_00->super_Node).K == KObjCProtoName) {
    bVar3 = ObjCProtoName::isObjCObject(this_00);
    if (!bVar3) goto LAB_001e1f6d;
    OutputStream::grow(s,3);
    pcVar1 = s->Buffer;
    sVar6 = s->CurrentPosition;
    pcVar1[sVar6 + 2] = '<';
    pcVar1 = pcVar1 + sVar6;
    pcVar1[0] = 'i';
    pcVar1[1] = 'd';
    s->CurrentPosition = s->CurrentPosition + 3;
    pcVar1 = (this_00->Protocol).First;
    sVar6 = (long)(this_00->Protocol).Last - (long)pcVar1;
    if (sVar6 == 0) {
      cVar5 = '>';
      goto LAB_001e201d;
    }
    OutputStream::grow(s,sVar6);
    memmove(s->Buffer + s->CurrentPosition,pcVar1,sVar6);
    cVar5 = '>';
  }
  else {
LAB_001e1f6d:
    (*(this_00->super_Node)._vptr_Node[4])(this_00,s);
    pNVar2 = this->Pointee;
    if (pNVar2->ArrayCache == Unknown) {
      iVar4 = (*pNVar2->_vptr_Node[1])(pNVar2,s);
      cVar7 = (char)iVar4;
    }
    else {
      cVar7 = pNVar2->ArrayCache == Yes;
    }
    if (cVar7 != '\0') {
      OutputStream::grow(s,1);
      s->Buffer[s->CurrentPosition] = ' ';
      s->CurrentPosition = s->CurrentPosition + 1;
    }
    pNVar2 = this->Pointee;
    if (pNVar2->ArrayCache == Unknown) {
      iVar4 = (*pNVar2->_vptr_Node[1])(pNVar2,s);
      cVar7 = (char)iVar4;
    }
    else {
      cVar7 = pNVar2->ArrayCache == Yes;
    }
    if (cVar7 == '\0') {
      pNVar2 = this->Pointee;
      if (pNVar2->FunctionCache == Unknown) {
        iVar4 = (*pNVar2->_vptr_Node[2])(pNVar2,s);
        cVar7 = (char)iVar4;
      }
      else {
        cVar7 = pNVar2->FunctionCache == Yes;
      }
      cVar5 = '*';
      if (cVar7 == '\0') goto LAB_001e201d;
    }
    sVar6 = 1;
    OutputStream::grow(s,1);
    s->Buffer[s->CurrentPosition] = '(';
    cVar5 = '*';
  }
  s->CurrentPosition = s->CurrentPosition + sVar6;
LAB_001e201d:
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = cVar5;
  s->CurrentPosition = s->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    // We rewrite objc_object<SomeProtocol>* into id<SomeProtocol>.
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      Pointee->printLeft(s);
      if (Pointee->hasArray(s))
        s += " ";
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += "(";
      s += "*";
    } else {
      const auto *objcProto = static_cast<const ObjCProtoName *>(Pointee);
      s += "id<";
      s += objcProto->Protocol;
      s += ">";
    }
  }